

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void reviseTimeZone(QDateTimeData *d,QTimeZone *zone,TransitionResolution resolve)

{
  undefined8 uVar1;
  uint uVar2;
  QDateTimePrivate *pQVar3;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  int iVar4;
  uint uVar5;
  QDateTimePrivate *pQVar6;
  
  uVar5 = (int)(zone->d).d - 1U & 3;
  pQVar6 = d->d;
  if (((ulong)pQVar6 & 1) == 0) {
    uVar2 = (pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar2 = (uint)(byte)pQVar6;
  }
  if (uVar5 == 3) {
    iVar4 = 0;
LAB_00348edf:
    if (((ulong)pQVar6 & 1) == 0) {
LAB_00348f3c:
      if ((pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        pQVar3 = (QDateTimePrivate *)operator_new(0x20);
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        uVar1 = *(undefined8 *)((long)&pQVar6->m_msecs + 4);
        *(undefined8 *)&pQVar3->m_status = *(undefined8 *)&pQVar6->m_status;
        *(undefined8 *)((long)&pQVar3->m_msecs + 4) = uVar1;
        QTimeZone::QTimeZone(&pQVar3->m_timeZone,&pQVar6->m_timeZone);
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 1;
        pQVar6 = d->d;
        LOCK();
        (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int>._M_i == 0) {
          pQVar6 = d->d;
          if (pQVar6 != (QDateTimePrivate *)0x0) {
            QTimeZone::~QTimeZone(&pQVar6->m_timeZone);
          }
          operator_delete(pQVar6,0x20);
        }
        goto LAB_00348fa3;
      }
    }
    else {
      pQVar3 = (QDateTimePrivate *)operator_new(0x20);
      pQVar3->super_QSharedData = (QAtomicInt)0x0;
      pQVar3->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
      pQVar3->m_msecs = 0;
      pQVar3->m_offsetFromUtc = 0;
      QTimeZone::QTimeZone(&pQVar3->m_timeZone);
      pQVar6 = d->d;
      (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (uint)pQVar6 & 0xfe;
      pQVar3->m_msecs = (long)pQVar6 >> 8;
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
LAB_00348fa3:
      d->d = pQVar3;
      pQVar6 = pQVar3;
    }
    (pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar5 << 4 | uVar2 & 0xffffff06;
    d->d->m_offsetFromUtc = iVar4;
    if (uVar5 == 3) {
      QTimeZone::operator=(&d->d->m_timeZone,zone);
      goto LAB_00349004;
    }
  }
  else {
    if (uVar5 == 2) {
      iVar4 = (int)((ulong)(zone->d).d >> 2);
      goto LAB_00348edf;
    }
    iVar4 = 0;
    if (((ulong)pQVar6 & 1) == 0) goto LAB_00348f3c;
    d->d = (QDateTimePrivate *)
           ((ulong)pQVar6 & 0xffffffffffffff00 | (ulong)(uVar5 << 4 | uVar2 & 7));
  }
  if (uVar5 - 1 < 2) {
    refreshSimpleDateTime(d);
    return;
  }
LAB_00349004:
  resolve_00.i = 0;
  if (resolve - LegacyBehavior < 6) {
    resolve_00.i = *(Int *)(&DAT_0055d01c + (ulong)(resolve - LegacyBehavior) * 4);
  }
  refreshZonedDateTime(d,zone,(TransitionOptions)resolve_00.i);
  return;
}

Assistant:

static void reviseTimeZone(QDateTimeData &d, const QTimeZone &zone,
                           QDateTime::TransitionResolution resolve)
{
    Qt::TimeSpec spec = zone.timeSpec();
    auto status = mergeSpec(getStatus(d), spec);
    bool reuse = d.isShort();
    int offset = 0;

    switch (spec) {
    case Qt::UTC:
        Q_ASSERT(zone.fixedSecondsAheadOfUtc() == 0);
        break;
    case Qt::OffsetFromUTC:
        reuse = false;
        offset = zone.fixedSecondsAheadOfUtc();
        Q_ASSERT(offset);
        break;
    case Qt::TimeZone:
        reuse = false;
        break;
    case Qt::LocalTime:
        break;
    }

    status &= ~(QDateTimePrivate::ValidDateTime | QDateTimePrivate::DaylightMask);
    if (reuse) {
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_offsetFromUtc = offset;
#if QT_CONFIG(timezone)
        if (spec == Qt::TimeZone)
            d->m_timeZone = zone;
#endif // timezone
    }

    if (QTimeZone::isUtcOrFixedOffset(spec))
        refreshSimpleDateTime(d);
    else
        refreshZonedDateTime(d, zone, toTransitionOptions(resolve));
}